

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_initCStream_usingCDict_advanced
                 (ZSTD_CStream *zcs,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ZSTD_CCtx_params *pZVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  ZSTD_CCtx_params in_stack_ffffffffffffff08;
  undefined1 local_80 [12];
  undefined4 uStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined8 uStack_68;
  undefined8 local_60;
  uint local_58;
  
  if (cdict != (ZSTD_CDict *)0x0) {
    lVar6 = 0xf;
    pZVar7 = &zcs->requestedParams;
    puVar8 = (undefined8 *)local_80;
    for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *(undefined8 *)pZVar7;
      pZVar7 = (ZSTD_CCtx_params *)&(pZVar7->cParams).chainLog;
      puVar8 = puVar8 + 1;
    }
    uVar1 = (cdict->cParams).hashLog;
    uVar2 = (cdict->cParams).searchLog;
    uVar3 = (cdict->cParams).searchLength;
    uStack_6c = uVar3;
    uStack_68._0_4_ = (cdict->cParams).targetLength;
    uStack_68._4_4_ = (cdict->cParams).strategy;
    local_80._4_4_ = (cdict->cParams).windowLog;
    local_80._8_4_ = (cdict->cParams).chainLog;
    uStack_74 = uVar1;
    local_70 = uVar2;
    local_60 = fParams._0_8_;
    local_58 = fParams.noDictIDFlag;
    puVar8 = (undefined8 *)local_80;
    puVar9 = (undefined8 *)&stack0xffffffffffffff08;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar9 = *puVar8;
      puVar8 = puVar8 + 1;
      puVar9 = puVar9 + 1;
    }
    sVar4 = ZSTD_initCStream_internal
                      (zcs,(void *)0x0,0,cdict,in_stack_ffffffffffffff08,pledgedSrcSize);
    return sVar4;
  }
  return 0xffffffffffffffe0;
}

Assistant:

size_t ZSTD_initCStream_usingCDict_advanced(ZSTD_CStream* zcs,
                                            const ZSTD_CDict* cdict,
                                            ZSTD_frameParameters fParams,
                                            unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingCDict_advanced");
    if (!cdict) return ERROR(dictionary_wrong); /* cannot handle NULL cdict (does not know what to do) */
    {   ZSTD_CCtx_params params = zcs->requestedParams;
        params.cParams = ZSTD_getCParamsFromCDict(cdict);
        params.fParams = fParams;
        return ZSTD_initCStream_internal(zcs,
                                NULL, 0, cdict,
                                params, pledgedSrcSize);
    }
}